

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::drawRadioButton
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *param_4)

{
  Int IVar1;
  QPixmapStylePrivate *this_00;
  QStyleOptionButton *r;
  QStyleOption *in_RSI;
  long in_FS_OFFSET;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  bool on;
  bool enabled;
  bool down;
  QStyleOptionButton *button;
  QPixmapStylePrivate *d;
  ControlPixmap control;
  StateFlag in_stack_ffffffffffffff6c;
  QFlags<QStyle::StateFlag> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8c;
  ControlPixmap local_40 [10];
  undefined4 local_18;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_14;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_10;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPixmapStyle *)0x3ff3aa);
  r = qstyleoption_cast<QStyleOptionButton_const*>(in_RSI);
  local_c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  bVar2 = IVar1 != 0;
  local_10.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  bVar3 = IVar1 != 0;
  local_14.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  uVar4 = IVar1 != 0;
  if ((bVar3 & 1) == 0) {
    local_18 = 9;
    if ((bool)uVar4) {
      local_18 = 10;
    }
  }
  else if ((bool)uVar4) {
    in_stack_ffffffffffffff88 = 7;
    local_18 = in_stack_ffffffffffffff88;
  }
  else {
    in_stack_ffffffffffffff88 = 6;
    local_18 = in_stack_ffffffffffffff88;
    if ((bVar2 & 1) != 0) {
      in_stack_ffffffffffffff88 = 8;
      local_18 = in_stack_ffffffffffffff88;
    }
  }
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            ((QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)
             CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(uVar4,CONCAT14(in_stack_ffffffffffffff8c,
                                                                   in_stack_ffffffffffffff88)))),
             local_40);
  QPainter::drawPixmap
            ((QPainter *)this_00,(QRect *)r,
             (QPixmap *)
             CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(uVar4,CONCAT14(in_stack_ffffffffffffff8c,
                                                                   in_stack_ffffffffffffff88)))));
  QPixmapStylePixmap::~QPixmapStylePixmap((QPixmapStylePixmap *)0x3ff514);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapStyle::drawRadioButton(const QStyleOption *option,
                                   QPainter *painter, const QWidget *) const
{
    Q_D(const QPixmapStyle);

    const QStyleOptionButton *button = qstyleoption_cast<const QStyleOptionButton*>(option);

    const bool down = button->state & State_Sunken;
    const bool enabled = button->state & State_Enabled;
    const bool on = button->state & State_On;

    ControlPixmap control;
    if (enabled)
        control = on ? RB_Checked : (down ? RB_Pressed : RB_Enabled);
    else
        control = on ? RB_DisabledChecked : RB_Disabled;
    painter->drawPixmap(button->rect, d->pixmaps.value(control).pixmap);
}